

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.cpp
# Opt level: O0

void push(int argc,char **argv)

{
  bool bVar1;
  int port_00;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  string local_9b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998 [8];
  string file;
  int local_974;
  undefined1 local_970 [4];
  int j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_938 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8 [8];
  string dir;
  int local_8b4;
  string local_8b0 [4];
  int i;
  string local_890 [32];
  undefined1 local_870 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  client_hashes;
  string local_850 [8];
  string server_hash;
  string local_820 [32];
  undefined1 local_800 [8];
  Msg msg;
  int sock;
  char *address;
  int port;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    printf("need 2 arguments");
  }
  port_00 = atoi(*argv);
  unique0x00012000 = argv[1];
  msg.buf2._992_4_ = client_start(port_00,unique0x00012000);
  std::__cxx11::string::string(local_820,(string *)HEAD_abi_cxx11_);
  fileToMsg((string *)local_820,(Msg *)local_800);
  std::__cxx11::string::~string(local_820);
  local_800._0_4_ = MSG_PUSH;
  send(msg.buf2._992_4_,local_800,0x7d4,0);
  recv(msg.buf2._992_4_,local_800,0x7d4,0x100);
  if (local_800._0_4_ == MSG_END) {
    printf("Repositories not compatible\n");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_850,msg.buf + 0x3e0,
               (allocator *)
               ((long)&client_hashes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&client_hashes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar2 = (char *)std::__cxx11::string::c_str();
    read_all_lines_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_870,pcVar2);
    std::__cxx11::string::string(local_890,(string *)HEAD_abi_cxx11_);
    fileToMsg((string *)local_890,(Msg *)local_800);
    std::__cxx11::string::~string(local_890);
    local_800._0_4_ = MSG_PULL;
    send(msg.buf2._992_4_,local_800,0x7d4,0);
    std::__cxx11::string::string(local_8b0,(string *)LOG_abi_cxx11_);
    fileToMsg((string *)local_8b0,(Msg *)local_800);
    std::__cxx11::string::~string(local_8b0);
    send(msg.buf2._992_4_,local_800,0x7d4,0);
    local_8b4 = 0;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_850,"");
    if (bVar1) {
      while( true ) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_870,(long)local_8b4);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_850,pvVar4);
        if (!bVar1) break;
        local_8b4 = local_8b4 + 1;
      }
      local_8b4 = local_8b4 + 1;
    }
    while (sVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_870), (ulong)(long)local_8b4 < sVar3) {
      std::operator+(local_918,COMMITS_DIR_abi_cxx11_);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_870,(long)local_8b4);
      std::__cxx11::string::string
                ((string *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar4);
      deleteEndl(local_938);
      std::operator+(local_8f8,local_918);
      std::operator+(local_8d8,(char *)local_8f8);
      std::__cxx11::string::~string((string *)local_8f8);
      std::__cxx11::string::~string((string *)local_938);
      std::__cxx11::string::~string
                ((string *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_918);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_970,pcVar2);
      for (local_974 = 0;
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_970), (ulong)(long)local_974 < sVar3; local_974 = local_974 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_970,(long)local_974);
        std::operator+(local_998,local_8d8);
        std::__cxx11::string::string(local_9b8,(string *)local_998);
        fileToMsg((string *)local_9b8,(Msg *)local_800);
        std::__cxx11::string::~string(local_9b8);
        local_800._0_4_ = MSG_PULL;
        send(msg.buf2._992_4_,local_800,0x7d4,0);
        std::__cxx11::string::~string((string *)local_998);
      }
      local_8b4 = local_8b4 + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_970);
      std::__cxx11::string::~string((string *)local_8d8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_870);
    std::__cxx11::string::~string(local_850);
  }
  client_stop();
  return;
}

Assistant:

void push(int argc, char *argv[]){
    if(argc < 2){
        printf("need 2 arguments");
    }
    int port = atoi(argv[0]);
    char *address = argv[1];
    int sock = client_start(port,address);

    Msg msg;
    fileToMsg(HEAD,msg);
    msg.type = MSG_PUSH;
    send(sock,&msg,sizeof(msg),0);
    recv(sock, &msg, sizeof(msg), MSG_WAITALL);
    if(msg.type != MSG_END){
        String server_hash = msg.buf2;
        Vector<String> client_hashes = read_all_lines(HEAD.c_str());
        fileToMsg(HEAD,msg);
        msg.type = MSG_PULL;
        send(sock,&msg,sizeof(msg),0);
        fileToMsg(LOG,msg);
        send(sock,&msg,sizeof(msg),0);
        int i = 0;
        if(server_hash != ""){
            while(server_hash != client_hashes[i]){
                i++;
            }
            i++;
        }
        while(i<client_hashes.size()){
            String dir = COMMITS_DIR + "/" + deleteEndl(client_hashes[i]) + "/";
            Vector<String> files = ls(dir.c_str());
            for(int j = 0; j < files.size();j++){
                String file = dir + files[j];
                fileToMsg(file,msg);
                msg.type = MSG_PULL;
                send(sock,&msg,sizeof(msg),0);
            }
            i++;
        }
    }
    else{
        printf("Repositories not compatible\n");
    }
    client_stop();
}